

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImFont_*>::reserve(ImVector<ImFont_*> *this,int new_capacity)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  ImFont **__dest;
  ImFont **ptr;
  
  pIVar2 = GImGui;
  if (this->Capacity < new_capacity) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImFont **)(*(pIVar2->IO).MemAllocFn)((long)new_capacity << 3);
    if (this->Data == (ImFont **)0x0) {
      ptr = (ImFont **)0x0;
    }
    else {
      memcpy(__dest,this->Data,(long)this->Size << 3);
      ptr = this->Data;
    }
    ImGui::MemFree(ptr);
    this->Data = __dest;
    this->Capacity = new_capacity;
  }
  return;
}

Assistant:

inline void                 reserve(int new_capacity)
    {
        if (new_capacity <= Capacity) return;
        T* new_data = (value_type*)ImGui::MemAlloc((size_t)new_capacity * sizeof(value_type));
        if (Data)
            memcpy(new_data, Data, (size_t)Size * sizeof(value_type));
        ImGui::MemFree(Data);
        Data = new_data;
        Capacity = new_capacity;
    }